

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O2

void mpiabi_cart_shift_(MPIABI_Fint *comm,MPIABI_Fint *direction,MPIABI_Fint *disp,int *rank_source,
                       int *rank_dest,MPIABI_Fint *ierror)

{
  mpi_cart_shift_();
  return;
}

Assistant:

void mpiabi_cart_shift_(
  const MPIABI_Fint * comm,
  const MPIABI_Fint * direction,
  const MPIABI_Fint * disp,
  int * rank_source,
  int * rank_dest,
  MPIABI_Fint * ierror
) {
  return mpi_cart_shift_(
    comm,
    direction,
    disp,
    rank_source,
    rank_dest,
    ierror
  );
}